

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O2

char __thiscall Fl_Preferences::get(Fl_Preferences *this,char *key,float *value,float defaultValue)

{
  char *__nptr;
  double dVar1;
  
  __nptr = Node::get(this->node,key);
  if (__nptr != (char *)0x0) {
    dVar1 = atof(__nptr);
    defaultValue = (float)dVar1;
  }
  *value = defaultValue;
  return __nptr != (char *)0x0;
}

Assistant:

char Fl_Preferences::get( const char *key, float &value, float defaultValue ) {
  const char *v = node->get( key );
  value = v ? (float)atof( v ) : defaultValue;
  return ( v != 0 );
}